

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O1

int __thiscall
btGeneric6DofSpring2Constraint::get_limit_motor_info2
          (btGeneric6DofSpring2Constraint *this,btRotationalLimitMotor2 *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float fVar1;
  float fVar2;
  btScalar *pbVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  btVector3 *pbVar10;
  int iVar11;
  btVector3 *pbVar12;
  int iVar13;
  ulong uVar14;
  btRotationalLimitMotor2 *pbVar15;
  ulong uVar16;
  bool bVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  btScalar bVar21;
  btScalar bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  
  uVar14 = (long)info->rowskip * (long)row;
  iVar13 = (int)uVar14;
  pbVar15 = limot;
  if (limot->m_currentLimit == 3) {
    calculateJacobi(this,limot,transA,transB,info,iVar13,ax1,rotational,rotAllowed);
    uVar16 = (ulong)iVar13;
    info->m_constraintError[uVar16] =
         (float)(int)(-(uint)(rotational != 0) | 1) *
         info->fps * limot->m_stopERP * limot->m_currentLimitError;
    info->m_lowerLimit[uVar16] = -3.4028235e+38;
    info->m_upperLimit[uVar16] = 3.4028235e+38;
    iVar11 = 1;
  }
  else {
    iVar11 = 0;
    if (limot->m_currentLimit != 4) goto LAB_00198ff4;
    pbVar12 = angVelB;
    pbVar10 = angVelA;
    if (rotational == 0) {
      pbVar12 = linVelB;
      pbVar10 = linVelA;
    }
    fVar24 = (pbVar10->m_floats[2] * ax1->m_floats[2] +
             pbVar10->m_floats[0] * ax1->m_floats[0] + pbVar10->m_floats[1] * ax1->m_floats[1]) -
             (ax1->m_floats[2] * pbVar12->m_floats[2] +
             ax1->m_floats[0] * pbVar12->m_floats[0] + ax1->m_floats[1] * pbVar12->m_floats[1]);
    pbVar15 = (btRotationalLimitMotor2 *)ax1;
    calculateJacobi(this,(btRotationalLimitMotor2 *)ax1,transA,transB,info,iVar13,ax1,rotational,
                    rotAllowed);
    fVar27 = *(float *)(&DAT_001f89d0 + (ulong)(rotational == 0) * 4);
    fVar23 = info->fps * limot->m_stopERP * limot->m_currentLimitError * fVar27;
    pbVar3 = info->m_constraintError;
    pbVar3[uVar14] = fVar23;
    fVar25 = fVar23 - limot->m_stopERP * fVar24;
    if (rotational == 0) {
      bVar22 = 0.0;
      if (0.0 <= fVar25) {
        bVar21 = -3.4028235e+38;
      }
      else {
        fVar25 = -limot->m_bounce * fVar24;
        bVar21 = -3.4028235e+38;
        if (fVar25 < fVar23) goto LAB_00198e84;
      }
    }
    else {
      bVar21 = 0.0;
      if (fVar25 <= 0.0) {
        bVar22 = 3.4028235e+38;
      }
      else {
        fVar25 = -limot->m_bounce * fVar24;
        bVar22 = 3.4028235e+38;
        if (fVar23 < fVar25) {
LAB_00198e84:
          pbVar3[uVar14] = fVar25;
        }
      }
    }
    info->m_lowerLimit[uVar14] = bVar21;
    info->m_upperLimit[uVar14] = bVar22;
    info->cfm[uVar14] = limot->m_stopCFM;
    uVar16 = (long)iVar13 + (long)info->rowskip;
    calculateJacobi(this,pbVar15,transA,transB,info,(int)uVar16,ax1,rotational,rotAllowed);
    fVar27 = fVar27 * info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi;
    pbVar3 = info->m_constraintError;
    pbVar3[uVar16] = fVar27;
    fVar23 = fVar27 - limot->m_stopERP * fVar24;
    if (rotational == 0) {
      bVar22 = 0.0;
      if (0.0 < fVar23) {
        fVar24 = fVar24 * -limot->m_bounce;
        bVar21 = 3.4028235e+38;
        bVar17 = fVar24 < fVar27;
        goto LAB_00198f8f;
      }
      bVar21 = 3.4028235e+38;
    }
    else {
      bVar21 = 0.0;
      if (fVar23 < 0.0) {
        fVar24 = fVar24 * -limot->m_bounce;
        bVar22 = -3.4028235e+38;
        bVar21 = 0.0;
        bVar17 = fVar27 < fVar24;
LAB_00198f8f:
        if (!bVar17 && fVar27 != fVar24) {
          pbVar3[uVar16] = fVar24;
        }
      }
      else {
        bVar22 = -3.4028235e+38;
      }
    }
    info->m_lowerLimit[uVar16] = bVar22;
    info->m_upperLimit[uVar16] = bVar21;
    iVar11 = 2;
    uVar14 = uVar16 & 0xffffffff;
  }
  info->cfm[uVar16] = limot->m_stopCFM;
  uVar14 = (ulong)(uint)((int)uVar14 + info->rowskip);
LAB_00198ff4:
  iVar13 = (int)uVar14;
  if ((limot->m_enableMotor == true) && (limot->m_servoMotor == false)) {
    calculateJacobi(this,pbVar15,transA,transB,info,iVar13,ax1,rotational,rotAllowed);
    bVar22 = limot->m_targetVelocity;
    if (rotational == 0) {
      bVar22 = -bVar22;
    }
    bVar22 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit,
                        limot->m_hiLimit,bVar22,info->fps * limot->m_motorERP);
    info->m_constraintError[iVar13] = bVar22 * limot->m_targetVelocity;
    info->m_lowerLimit[iVar13] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar13] = limot->m_maxMotorForce;
    info->cfm[iVar13] = limot->m_motorCFM;
    iVar13 = iVar13 + info->rowskip;
    iVar11 = iVar11 + 1;
  }
  if ((limot->m_enableMotor == true) && (limot->m_servoMotor == true)) {
    fVar27 = limot->m_currentPosition - limot->m_servoTarget;
    calculateJacobi(this,pbVar15,transA,transB,info,iVar13,ax1,rotational,rotAllowed);
    fVar23 = 0.0;
    fVar25 = (float)(~-(uint)(fVar27 < 0.0) & (uint)limot->m_targetVelocity |
                    (uint)-limot->m_targetVelocity & -(uint)(fVar27 < 0.0));
    if ((fVar27 != 0.0) || (NAN(fVar27))) {
      fVar23 = limot->m_loLimit;
      fVar24 = limot->m_hiLimit;
      if (fVar23 <= fVar24) {
        if ((fVar27 <= 0.0) || (bVar22 = limot->m_servoTarget, limot->m_servoTarget <= fVar23)) {
          bVar22 = fVar23;
        }
        if ((fVar27 < 0.0) && (limot->m_servoTarget < fVar24)) {
          fVar24 = limot->m_servoTarget;
        }
      }
      else {
        if (fVar27 <= 0.0) {
          bVar22 = -3.4028235e+38;
        }
        else {
          bVar22 = limot->m_servoTarget;
        }
        if (0.0 <= fVar27) {
          fVar24 = 3.4028235e+38;
        }
        else {
          fVar24 = limot->m_servoTarget;
        }
      }
      fVar23 = btTypedConstraint::getMotorFactor
                         (&this->super_btTypedConstraint,limot->m_currentPosition,bVar22,fVar24,
                          -fVar25,info->fps * limot->m_motorERP);
    }
    info->m_constraintError[iVar13] = (float)(int)(-(uint)(rotational != 0) | 1) * fVar25 * fVar23;
    info->m_lowerLimit[iVar13] = -limot->m_maxMotorForce;
    info->m_upperLimit[iVar13] = limot->m_maxMotorForce;
    info->cfm[iVar13] = limot->m_motorCFM;
    iVar13 = iVar13 + info->rowskip;
    iVar11 = iVar11 + 1;
  }
  if (limot->m_enableSpring == true) {
    fVar27 = limot->m_currentPosition;
    fVar23 = limot->m_equilibriumPoint;
    calculateJacobi(this,pbVar15,transA,transB,info,iVar13,ax1,rotational,rotAllowed);
    fVar28 = 1.0 / info->fps;
    fVar25 = limot->m_springStiffness;
    fVar24 = limot->m_springDamping;
    if (rotational == 0) {
      angVelA = linVelA;
      angVelB = linVelB;
    }
    fVar4 = ax1->m_floats[0];
    fVar5 = ax1->m_floats[1];
    fVar6 = ax1->m_floats[2];
    fVar7 = angVelA->m_floats[0];
    fVar8 = angVelA->m_floats[1];
    fVar9 = angVelA->m_floats[2];
    fVar29 = angVelB->m_floats[0];
    fVar1 = angVelB->m_floats[1];
    fVar2 = angVelB->m_floats[2];
    auVar20._4_4_ = ((this->super_btTypedConstraint).m_rbB)->m_inverseMass;
    auVar20._0_4_ = ((this->super_btTypedConstraint).m_rbA)->m_inverseMass;
    auVar20._8_8_ = 0;
    auVar20 = divps(_DAT_001f53f0,auVar20);
    fVar26 = auVar20._4_4_;
    if (auVar20._0_4_ <= auVar20._4_4_) {
      fVar26 = auVar20._0_4_;
    }
    fVar19 = fVar25 / fVar26;
    if (fVar19 < 0.0) {
      fVar19 = sqrtf(fVar19);
    }
    else {
      fVar19 = SQRT(fVar19);
    }
    if (limot->m_springStiffnessLimited != false) {
      uVar18 = -(uint)(0.25 < fVar19 * fVar28);
      fVar25 = (float)(~uVar18 & (uint)fVar25 |
                      (uint)(((1.0 / fVar28) / fVar28) * 0.0625 * fVar26) & uVar18);
    }
    fVar29 = (fVar6 * fVar9 + fVar4 * fVar7 + fVar8 * fVar5) -
             (fVar6 * fVar2 + fVar4 * fVar29 + fVar1 * fVar5);
    if (limot->m_springDampingLimited != false) {
      uVar18 = -(uint)(fVar26 < fVar24 * fVar28);
      fVar24 = (float)(~uVar18 & (uint)fVar24 | (uint)(fVar26 / fVar28) & uVar18);
    }
    fVar24 = -fVar24 * fVar29 * *(float *)(&DAT_001f89d0 + (ulong)(rotational == 0) * 4) * fVar28;
    fVar27 = (fVar27 - fVar23) * fVar25 * fVar28 + fVar24;
    info->m_constraintError[iVar13] =
         *(float *)(&DAT_001f89d0 + (ulong)(rotational == 0) * 4) * fVar27 + fVar29;
    fVar23 = fVar24;
    if (fVar24 <= fVar27) {
      fVar23 = fVar27;
      fVar27 = fVar24;
    }
    if (rotational == 0) {
      fVar25 = 0.0;
      if (fVar27 <= 0.0) {
        fVar25 = fVar27;
      }
      info->m_lowerLimit[iVar13] = fVar25;
    }
    else {
      fVar25 = 0.0;
      if (-fVar23 <= 0.0) {
        fVar25 = -fVar23;
      }
      info->m_lowerLimit[iVar13] = fVar25;
      fVar23 = -fVar27;
    }
    fVar27 = 0.0;
    if (0.0 <= fVar23) {
      fVar27 = fVar23;
    }
    info->m_upperLimit[iVar13] = fVar27;
    info->cfm[iVar13] = 0.0;
    iVar11 = iVar11 + 1;
  }
  return iVar11;
}

Assistant:

int btGeneric6DofSpring2Constraint::get_limit_motor_info2(
	btRotationalLimitMotor2 * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
	int count = 0;
	int srow = row * info->rowskip;

	if (limot->m_currentLimit==4) 
	{
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? 0 : -SIMD_INFINITY;
		info->m_upperLimit[srow] = rotational ? SIMD_INFINITY : 0;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;

		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitErrorHi * (rotational ? -1 : 1);
		if (rotational) {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP < 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror < info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		} else {
			if (info->m_constraintError[srow]-vel*limot->m_stopERP > 0) {
				btScalar bounceerror = -limot->m_bounce* vel;
				if (bounceerror > info->m_constraintError[srow]) info->m_constraintError[srow] = bounceerror;
			}
		}
		info->m_lowerLimit[srow] = rotational ? -SIMD_INFINITY : 0;
		info->m_upperLimit[srow] = rotational ? 0 : SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	} else
	if (limot->m_currentLimit==3) 
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		info->m_constraintError[srow] = info->fps * limot->m_stopERP * limot->m_currentLimitError * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -SIMD_INFINITY;
		info->m_upperLimit[srow] = SIMD_INFINITY;
		info->cfm[srow] = limot->m_stopCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && !limot->m_servoMotor)
	{
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;
		btScalar mot_fact = getMotorFactor(limot->m_currentPosition, 
			limot->m_loLimit,
			limot->m_hiLimit,
			tag_vel,
			info->fps * limot->m_motorERP);
		info->m_constraintError[srow] = mot_fact * limot->m_targetVelocity;
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableMotor && limot->m_servoMotor)
	{
		btScalar error = limot->m_currentPosition - limot->m_servoTarget;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);
		btScalar targetvelocity = error<0 ? -limot->m_targetVelocity : limot->m_targetVelocity;
		btScalar tag_vel = -targetvelocity;
		btScalar mot_fact;
		if(error != 0)
		{
			btScalar lowLimit;
			btScalar hiLimit;
			if(limot->m_loLimit > limot->m_hiLimit)
			{
				lowLimit = error > 0 ? limot->m_servoTarget : -SIMD_INFINITY;
				hiLimit  = error < 0 ? limot->m_servoTarget :  SIMD_INFINITY;
			}
			else
			{
				lowLimit = error > 0 && limot->m_servoTarget>limot->m_loLimit ? limot->m_servoTarget : limot->m_loLimit;
				hiLimit  = error < 0 && limot->m_servoTarget<limot->m_hiLimit ? limot->m_servoTarget : limot->m_hiLimit;
			}
			mot_fact = getMotorFactor(limot->m_currentPosition, lowLimit, hiLimit, tag_vel, info->fps * limot->m_motorERP);
		} 
		else 
		{
			mot_fact = 0;
		}
		info->m_constraintError[srow] = mot_fact * targetvelocity * (rotational ? -1 : 1);
		info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
		info->m_upperLimit[srow] = limot->m_maxMotorForce;
		info->cfm[srow] = limot->m_motorCFM;
		srow += info->rowskip;
		++count;
	}

	if (limot->m_enableSpring)
	{
		btScalar error = limot->m_currentPosition - limot->m_equilibriumPoint;
		calculateJacobi(limot,transA,transB,info,srow,ax1,rotational,rotAllowed);

		//btScalar cfm = 1.0 / ((1.0/info->fps)*limot->m_springStiffness+ limot->m_springDamping);
		//if(cfm > 0.99999)
		//	cfm = 0.99999;
		//btScalar erp = (1.0/info->fps)*limot->m_springStiffness / ((1.0/info->fps)*limot->m_springStiffness + limot->m_springDamping);
		//info->m_constraintError[srow] = info->fps * erp * error * (rotational ? -1.0 : 1.0);
		//info->m_lowerLimit[srow] = -SIMD_INFINITY;
		//info->m_upperLimit[srow] = SIMD_INFINITY;

		btScalar dt = BT_ONE / info->fps;
		btScalar kd = limot->m_springDamping;
		btScalar ks = limot->m_springStiffness;
		btScalar vel = rotational ? angVelA.dot(ax1) - angVelB.dot(ax1) : linVelA.dot(ax1) - linVelB.dot(ax1);
//		btScalar erp = 0.1;
		btScalar cfm = BT_ZERO;
		btScalar mA = BT_ONE / m_rbA.getInvMass();
		btScalar mB = BT_ONE / m_rbB.getInvMass();
		btScalar m = mA > mB ? mB : mA;
		btScalar angularfreq = sqrt(ks / m);


		//limit stiffness (the spring should not be sampled faster that the quarter of its angular frequency)
		if(limot->m_springStiffnessLimited && 0.25 < angularfreq * dt)
		{
			ks = BT_ONE / dt / dt / btScalar(16.0) * m;
		}
		//avoid damping that would blow up the spring
		if(limot->m_springDampingLimited && kd * dt > m)
		{
			kd = m / dt;
		}
		btScalar fs = ks * error * dt;
		btScalar fd = -kd * (vel) * (rotational ? -1 : 1) * dt;
		btScalar f = (fs+fd);

		info->m_constraintError[srow] = (vel + f * (rotational ? -1 : 1)) ;

		btScalar minf = f < fd ? f : fd;
		btScalar maxf = f < fd ? fd : f;
		if(!rotational)
		{
			info->m_lowerLimit[srow] = minf > 0 ? 0 : minf;
			info->m_upperLimit[srow] = maxf < 0 ? 0 : maxf;
		}
		else
		{
			info->m_lowerLimit[srow] = -maxf > 0 ? 0 : -maxf;
			info->m_upperLimit[srow] = -minf < 0 ? 0 : -minf;
		}

		info->cfm[srow] = cfm;
		srow += info->rowskip;
		++count;
	}

	return count;
}